

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# boosting.cc
# Opt level: O3

int64_t choose(int64_t n,int64_t k)

{
  long lVar1;
  long lVar2;
  bool bVar3;
  
  if (k < 0 || n < k) {
    return 0;
  }
  lVar1 = 1;
  if (k != 0 && k != n) {
    lVar2 = 1;
    do {
      lVar1 = lVar1 * n;
      n = n + -1;
      lVar1 = lVar1 / lVar2;
      bVar3 = lVar2 != k;
      lVar2 = lVar2 + 1;
    } while (bVar3);
  }
  return lVar1;
}

Assistant:

int64_t choose(int64_t n, int64_t k)
{
  if (k > n)
    return 0;
  if (k < 0)
    return 0;
  if (k == n)
    return 1;
  if (k == 0 && n != 0)
    return 1;
  int64_t r = 1;
  for (int64_t d = 1; d <= k; ++d)
  {
    r *= n--;
    r /= d;
  }
  return r;
}